

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

Matrix<double,_4,_4,_0,_4,_4> *
getGTTransformations<double>(Matrix<double,_4,_4,_0,_4,_4> *__return_storage_ptr__,bool verbose)

{
  int iVar1;
  ostream *poVar2;
  undefined7 in_register_00000031;
  double dVar3;
  double dVar4;
  double dVar5;
  Matrix<double,_3,_1,_0,_3,_1> tranGT;
  Type local_168;
  Matrix<double,_3,_3,_0,_3,_3> rotGT;
  DenseBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>_>
  local_e8 [32];
  AngleAxis<double> local_c8;
  DenseBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>_>
  local_a8 [32];
  AngleAxis<double> local_88;
  DenseBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>_>
  local_68 [32];
  AngleAxis<double> local_48;
  
  Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::Identity
            ((IdentityReturnType *)&rotGT,4,4);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,4,4,0,4,4>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,4,4,0,4,4>>>
            (__return_storage_ptr__,(IdentityReturnType *)&rotGT);
  iVar1 = rand();
  dVar3 = (double)(iVar1 % 200) / 5.0;
  iVar1 = rand();
  dVar4 = (double)(iVar1 % 200) / 5.0;
  iVar1 = rand();
  dVar5 = (double)(iVar1 % 200) / 5.0;
  if ((int)CONCAT71(in_register_00000031,verbose) != 0) {
    std::operator<<((ostream *)&std::cout,"Rand() angles = (");
    poVar2 = std::ostream::_M_insert<double>(dVar3);
    std::operator<<(poVar2,",");
    poVar2 = std::ostream::_M_insert<double>(dVar4);
    std::operator<<(poVar2,",");
    poVar2 = std::ostream::_M_insert<double>(dVar5);
    poVar2 = std::operator<<(poVar2,")");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::UnitZ();
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,3,1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_48,local_68);
  local_48.m_angle = (dVar5 * 3.141592653589793) / 360.0;
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::UnitY();
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,3,1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_88,local_a8);
  local_88.m_angle = (dVar4 * 3.141592653589793) / 360.0;
  Eigen::AngleAxis<double>::operator*((QuaternionType *)&tranGT,&local_48,&local_88);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::UnitX();
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,3,1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_c8,local_e8);
  local_c8.m_angle = (dVar3 * 3.141592653589793) / 360.0;
  Eigen::operator*((QuaternionType *)&local_168,(QuaternionType *)&tranGT,&local_c8);
  Eigen::Matrix<double,3,3,0,3,3>::operator=
            ((Matrix<double,3,3,0,3,3> *)&rotGT,
             (RotationBase<Eigen::Quaternion<double,_0>,_3> *)&local_168);
  if (verbose) {
    poVar2 = std::operator<<((ostream *)&std::cout,"GT Rotation Matrix: ");
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = Eigen::operator<<(poVar2,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&rotGT);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  iVar1 = rand();
  tranGT.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (double)(iVar1 % 200) / 10.0 + -10.0;
  iVar1 = rand();
  tranGT.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (double)(iVar1 % 200) / 10.0 + -10.0;
  iVar1 = rand();
  tranGT.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (double)(iVar1 % 200) / 10.0 + -10.0;
  if (verbose) {
    poVar2 = std::operator<<((ostream *)&std::cout,"GT Translation Vector: ");
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    local_168.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
         (PointerType)&tranGT;
    poVar2 = Eigen::operator<<(poVar2,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                       *)&local_168);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
            (&local_168,__return_storage_ptr__,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::Matrix<double,3,3,0,3,3>>
            (&local_168,&rotGT);
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topRightCorner<int,int>
            (&local_168,__return_storage_ptr__,3,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::Matrix<double,3,1,0,3,1>>
            (&local_168,&tranGT);
  return __return_storage_ptr__;
}

Assistant:

Matrix<floatPrec, 4, 4> getGTTransformations(bool verbose)
{

  Matrix<floatPrec, 4, 4> transOut;

  // init the output
  transOut = Matrix<floatPrec, 4, 4>::Identity(4, 4);

  floatPrec angX, angY, angZ;
  Matrix<floatPrec, 3, 3> rotGT;
  Matrix<floatPrec, 3, 1> tranGT;

  // generate random angles
  angX = (rand() % 200) / 5.0;
  angY = (rand() % 200) / 5.0;
  angZ = (rand() % 200) / 5.0;
  if (verbose)
    cout << "Rand() angles = (" << angX << "," << angY << "," << angZ << ")" << endl;

  // create a rotation matrix
  rotGT = AngleAxis<floatPrec>(angZ * M_PI / 360, Matrix<floatPrec, 3, 1>::UnitZ()) *
          AngleAxis<floatPrec>(angY * M_PI / 360, Matrix<floatPrec, 3, 1>::UnitY()) *
          AngleAxis<floatPrec>(angX * M_PI / 360, Matrix<floatPrec, 3, 1>::UnitX());
  if (verbose)
    cout << "GT Rotation Matrix: " << endl
         << rotGT << endl;
  // cout << rotGT.transpose()*rotGT << endl;

  // create a translation vector
  tranGT(0) = rand() % 200 / 10.0 - 10.0;
  tranGT(1) = rand() % 200 / 10.0 - 10.0;
  tranGT(2) = rand() % 200 / 10.0 - 10.0;
  if (verbose)
    cout << "GT Translation Vector: " << endl
         << tranGT.transpose() << endl;

  transOut.topLeftCorner(3, 3) = rotGT;
  transOut.topRightCorner(3, 1) = tranGT;

  return transOut;
}